

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>>::
emplace<QModelIndex,unsigned_int_const&>
          (QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>> *this,qsizetype i,
          QModelIndex *args,uint *args_1)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  QPersistentModelIndex QVar4;
  long in_FS_OFFSET;
  Inserter local_70;
  QPersistentModelIndex local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = *(int **)this;
  if ((piVar1 == (int *)0x0) || (1 < *piVar1)) {
LAB_004719db:
    local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::QPersistentModelIndex(&local_48,args);
    puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,*args_1);
    lVar2 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this,
               (uint)(i == 0 && lVar2 != 0),1,(pair<QPersistentModelIndex,_unsigned_int> **)0x0,
               (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0);
    QVar4.d = local_48.d;
    if (i == 0 && lVar2 != 0) {
      lVar2 = *(long *)(this + 8);
      local_48.d = (QPersistentModelIndexData *)0x0;
      *(QPersistentModelIndexData **)(lVar2 + -0x10) = QVar4.d;
      *(uint *)(lVar2 + -8) = (uint)puStack_40;
      *(long *)(this + 8) = lVar2 + -0x10;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      local_70.displaceFrom =
           (pair<QPersistentModelIndex,_unsigned_int> *)(*(long *)(this + 8) + i * 0x10);
      local_70.displaceTo =
           (pair<QPersistentModelIndex,_unsigned_int> *)(*(long *)(this + 8) + i * 0x10 + 0x10);
      local_70.nInserts = 1;
      local_70.bytes = (*(long *)(this + 0x10) - i) * 0x10;
      local_70.data = (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this;
      memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
      QVar4.d = local_48.d;
      local_48.d = (QPersistentModelIndexData *)0x0;
      ((local_70.displaceFrom)->first).d = QVar4.d;
      (local_70.displaceFrom)->second = (uint)puStack_40;
      local_70.displaceFrom = local_70.displaceFrom + 1;
      QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::~Inserter
                (&local_70);
    }
    QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  }
  else {
    lVar2 = *(long *)(this + 0x10);
    if ((lVar2 == i && piVar1 != (int *)0x0) &&
       (*(long *)(piVar1 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar1 + 0x1fU & 0xfffffffffffffff0)) >> 4) + lVar2)) {
      lVar3 = *(long *)(this + 8);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)(lVar3 + lVar2 * 0x10),args);
      *(uint *)(lVar3 + 8 + lVar2 * 0x10) = *args_1;
    }
    else {
      if (((i != 0) || (piVar1 == (int *)0x0)) ||
         (((long)piVar1 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_004719db;
      lVar2 = *(long *)(this + 8);
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(lVar2 + -0x10),args);
      *(uint *)(lVar2 + -8) = *args_1;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }